

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobalObject.cpp
# Opt level: O2

BOOL Js::GlobalObject::MatchPatternHelper
               (JavascriptString *propertyName,JavascriptString *pattern,
               ScriptContext *scriptContext)

{
  charcount_t index;
  char16 cVar1;
  char16 cVar2;
  charcount_t cVar3;
  charcount_t cVar4;
  int iVar5;
  Var aValue;
  JavascriptString *__needle;
  char *pcVar6;
  uint idxStart;
  bool bVar7;
  
  if (pattern == (JavascriptString *)0x0 || propertyName == (JavascriptString *)0x0) {
LAB_00a2748b:
    bVar7 = false;
  }
  else {
    cVar3 = JavascriptString::GetLength(pattern);
    cVar4 = JavascriptString::GetLength(propertyName);
    bVar7 = true;
    if (cVar3 == 0) goto LAB_00a27565;
    cVar1 = JavascriptString::GetItem(pattern,0);
    index = cVar3 - 1;
    cVar2 = JavascriptString::GetItem(pattern,index);
    if (cVar1 == L'*' || cVar2 == L'*') {
      if (cVar2 == L'*') {
        cVar3 = index;
      }
      idxStart = (uint)(cVar1 == L'*');
      if (cVar3 - idxStart == 0 || (int)cVar3 < (int)idxStart) goto LAB_00a27565;
      aValue = JavascriptString::SubstringCore(pattern,idxStart,cVar3 - idxStart,scriptContext);
      __needle = VarTo<Js::JavascriptString>(aValue);
      pcVar6 = JavascriptString::strstr((char *)propertyName,(char *)__needle);
      iVar5 = (int)pcVar6;
      if (iVar5 == -1) goto LAB_00a2748b;
      if (cVar1 == L'*') {
        if (cVar2 != L'*') {
          bVar7 = index + iVar5 == cVar4;
        }
        goto LAB_00a27565;
      }
    }
    else {
      iVar5 = JavascriptString::strcmp((char *)propertyName,(char *)pattern);
    }
    bVar7 = iVar5 == 0;
  }
LAB_00a27565:
  return (BOOL)bVar7;
}

Assistant:

BOOL GlobalObject::MatchPatternHelper(JavascriptString *propertyName, JavascriptString *pattern, ScriptContext *scriptContext)
    {
        if (nullptr == propertyName || nullptr == pattern)
        {
            return FALSE;
        }

        charcount_t     patternLength = pattern->GetLength();
        charcount_t     nameLength = propertyName->GetLength();
        BOOL    bStart;
        BOOL    bEnd;

        if (0 == patternLength)
        {
            return TRUE; // empty pattern matches all
        }

        bStart = (_u('*') == pattern->GetItem(0));// Is there a start star?
        bEnd = (_u('*') == pattern->GetItem(patternLength - 1));// Is there an end star?

        //deal with the stars
        if (bStart || bEnd)
        {
            JavascriptString *subPattern;
            int idxStart = bStart? 1: 0;
            int idxEnd   = bEnd? (patternLength - 1): patternLength;
            if (idxEnd <= idxStart)
            {
                return TRUE; //scenario double star **
            }

            //get a pattern which doesn't contain leading and trailing stars
            subPattern = VarTo<JavascriptString>(JavascriptString::SubstringCore(pattern, idxStart, idxEnd - idxStart, scriptContext));

            uint index = JavascriptString::strstr(propertyName, subPattern, false);

            if (index == (uint)-1)
            {
                return FALSE;
            }
            if (FALSE == bStart)
            {
                return index == 0; //begin at the same place;
            }
            else if (FALSE == bEnd)
            {
                return (index + patternLength - 1) == (nameLength);
            }
            return TRUE;
        }
        else
        {
            //full match
            if (0 == JavascriptString::strcmp(propertyName, pattern))
            {
                return TRUE;
            }
        }

        return FALSE;
    }